

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O1

void do_permonst(char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  byte *pbVar10;
  char *extraout_RAX;
  char *pcVar11;
  char cVar12;
  uint uVar13;
  byte *pbVar14;
  long *plVar15;
  char *__filename;
  ulong uVar16;
  msghdr *__filename_00;
  int *unaff_RBP;
  byte bVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  byte bVar21;
  char *__filename_01;
  long lVar22;
  long lVar23;
  long lVar24;
  char *unaff_R12;
  permonst *ppVar25;
  uint uVar26;
  char *unaff_R13;
  char cVar27;
  msghdr *unaff_R15;
  msghdr *__filename_02;
  char (*__s2) [3];
  char acStack_3f0 [256];
  long alStack_2f0 [33];
  char *pcStack_1e8;
  char *pcStack_1e0;
  char *pcStack_1d8;
  char *pcStack_1d0;
  msghdr *pmStack_1c8;
  code *pcStack_1c0;
  char *pcStack_1b8;
  msghdr *pmStack_1b0;
  char *pcStack_1a8;
  char *pcStack_1a0;
  char *pcStack_198;
  msghdr *pmStack_190;
  code *pcStack_188;
  int iStack_174;
  char acStack_170 [264];
  char *pcStack_68;
  
  pcVar18 = "w+";
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    fwrite("#ifndef PM_H\n#define PM_H\n",0x1a,1,(FILE *)ofp);
    iVar4 = strcmp("giant ant","playermon");
    if (iVar4 != 0) {
      fwrite("\n#define\tPM_PLAYERMON\t(-1)",0x1a,1,(FILE *)ofp);
    }
    cVar27 = '\x01';
    uVar16 = 0;
    ppVar25 = mons;
    do {
      fwrite("\n#define\tPM_",0xc,1,(FILE *)ofp);
      if ((cVar27 == '5') && (iVar4 = strncmp(ppVar25->mname,"were",4), iVar4 == 0)) {
        fwrite("HUMAN_",6,1,(FILE *)ofp);
      }
      strncpy(&tmpdup_buf,ppVar25->mname,0x7f);
      if (tmpdup_buf != '\0') {
        pcVar18 = &DAT_0014f2b1;
        cVar27 = tmpdup_buf;
        do {
          if ((byte)(cVar27 + 0x9fU) < 0x1a) {
            cVar12 = cVar27 + -0x20;
LAB_0010a7ca:
            pcVar18[-1] = cVar12;
          }
          else {
            cVar12 = '_';
            if ((byte)(cVar27 + 0xa5U) < 0xe6) goto LAB_0010a7ca;
          }
          cVar27 = *pcVar18;
          pcVar18 = pcVar18 + 1;
        } while (cVar27 != '\0');
      }
      fprintf((FILE *)ofp,"%s\t%d",&tmpdup_buf,uVar16 & 0xffffffff);
      uVar16 = uVar16 + 1;
      ppVar25 = mons + uVar16;
      cVar27 = mons[uVar16].mlet;
      if (cVar27 == '\0') {
        fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",uVar16 & 0xffffffff);
        fwrite("\n#endif /* PM_H */\n",0x13,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  __filename_00 = (msghdr *)pcVar18;
  pcVar18 = outfile;
  do_permonst_cold_1();
  pcVar19 = "r";
  pcStack_188 = (code *)0x10a885;
  pcStack_68 = outfile;
  ifp = (FILE *)fopen(pcVar18,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ae55:
    pcStack_188 = (code *)0x10ae5d;
    do_questtxt_cold_7();
  }
  else {
    pcVar19 = "w+";
    pcStack_188 = (code *)0x10a8a4;
    ofp = (FILE *)fopen((char *)__filename_00,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_188 = (code *)0x10a8e1;
      pcVar19 = fgets(in_line,0x50,(FILE *)ifp);
      if (pcVar19 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = acStack_170;
        unaff_RBP = &iStack_174;
        unaff_R15 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          pcVar18 = (char *)(ulong)(uint)qt_line;
          if ((in_line._0_4_ & 0xff) != 0x23) {
            if (((in_line._0_4_ & 0xff) == 0x25) &&
               ((uVar13 = (uint)in_line._0_4_ >> 8 & 0xff, uVar13 == 0x45 || (uVar13 == 0x43)))) {
              iStack_174 = 0;
              uVar13 = (uint)in_line._0_4_ >> 8 & 0xff;
              if (uVar13 == 0x45) {
                if (in_msg != '\0') {
                  in_msg = '\0';
                  goto LAB_0010aadd;
                }
                pcVar19 = "End record encountered before message - line %d\n";
              }
              else if (uVar13 == 0x43) {
                if (in_msg == '\0') {
                  in_msg = '\x01';
                  pcStack_188 = (code *)0x10a994;
                  iVar4 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                  if (iVar4 == 2) {
                    pcStack_188 = (code *)0x10a9a5;
                    iVar5 = get_hdr(unaff_R13);
                    iVar4 = qt_hdr.n_hdr;
                    if (iVar5 == 0) {
                      pcVar18 = (char *)(long)qt_hdr.n_hdr;
                      if ((long)pcVar18 < 0x10) {
                        pcStack_188 = (code *)0x10a9da;
                        strncpy(qt_hdr.id[(long)pcVar18],unaff_R13,3);
                        lVar7 = (long)qt_hdr.n_hdr;
                        msg_hdr[lVar7].n_msg = 0;
                        qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                        qt_hdr.offset[lVar7] = 0;
                      }
                      else {
                        pcStack_188 = (code *)0x10ab85;
                        do_questtxt_cold_2();
                      }
                      if (0xf < iVar4) goto LAB_0010aadd;
                    }
                    pcStack_188 = (code *)0x10aa1b;
                    iVar4 = get_hdr(unaff_R13);
                    lVar7 = (long)(iVar4 + -1);
                    lVar8 = lVar7 * 0x2ee8 + 0x1203f8;
                    iVar4 = msg_hdr[lVar7].n_msg;
                    lVar20 = (long)iVar4;
                    if (0 < lVar20) {
                      lVar22 = 0;
                      do {
                        if (*(int *)(lVar8 + lVar22) == iStack_174) {
                          pcStack_188 = (code *)0x10ab7b;
                          do_questtxt_cold_4();
                          goto LAB_0010aadd;
                        }
                        lVar22 = lVar22 + 0x18;
                      } while (lVar20 * 0x18 != lVar22);
                    }
                    if (iVar4 < 500) {
                      msg_hdr[lVar7].n_msg = iVar4 + 1;
                      curr_msg = (qtmsg *)(lVar8 + lVar20 * 0x18);
                      curr_msg->msgnum = iStack_174;
                      curr_msg->delivery = in_line[2];
                      curr_msg->offset = 0;
                      curr_msg->size = 0;
                    }
                    else {
                      pcStack_188 = (code *)0x10ab71;
                      do_questtxt_cold_3();
                    }
                  }
                  else {
                    pcStack_188 = (code *)0x10ab67;
                    do_questtxt_cold_1();
                  }
                  goto LAB_0010aadd;
                }
                pcVar19 = "Control record encountered during message - line %d\n";
              }
              else {
                pcVar19 = "Unrecognized Control record at line %d\n";
              }
              pcStack_188 = (code *)0x10ab5d;
              fprintf(_stderr,pcVar19,(ulong)(uint)qt_line);
            }
            else {
              if (in_msg == '\0') {
                pcStack_188 = (code *)0x10aaa9;
                sVar9 = strlen(in_line);
                if (sVar9 == 1) goto LAB_0010aadd;
              }
              if (in_msg == '\0') {
                pcStack_188 = (code *)0x10ab1a;
                fprintf(_stderr,"Text encountered outside message - line %d\n",pcVar18);
              }
              pcStack_188 = (code *)0x10aac0;
              sVar9 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar9;
            }
          }
LAB_0010aadd:
          pcStack_188 = (code *)0x10aaf1;
          pcVar19 = fgets(in_line,0x50,(FILE *)ifp);
          __filename_00 = (msghdr *)in_line;
        } while (pcVar19 != (char *)0x0);
      }
      pcStack_188 = (code *)0x10ab9a;
      fseek((FILE *)ifp,0,0);
      iVar4 = qt_hdr.n_hdr;
      in_msg = '\0';
      lVar7 = (long)qt_hdr.n_hdr;
      lVar8 = lVar7 * 0xb + 4;
      if (0 < lVar7) {
        plVar15 = qt_hdr.offset;
        lVar20 = 0;
        do {
          *plVar15 = lVar8;
          lVar8 = lVar8 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar20 + -8) * 0x18 + 4;
          lVar20 = lVar20 + 0x2ee8;
          plVar15 = plVar15 + 1;
        } while (lVar7 * 0x2ee8 - lVar20 != 0);
      }
      if (0 < iVar4) {
        lVar20 = 0x120408;
        lVar22 = 0;
        lVar23 = 0;
        do {
          iVar4 = msg_hdr[lVar22].n_msg;
          if (0 < (long)iVar4) {
            lVar24 = 0;
            do {
              *(long *)(lVar20 + -8 + lVar24) = lVar23 + lVar8;
              lVar23 = lVar23 + *(long *)(lVar20 + lVar24);
              lVar24 = lVar24 + 0x18;
            } while ((long)iVar4 * 0x18 != lVar24);
          }
          lVar22 = lVar22 + 1;
          lVar20 = lVar20 + 0x2ee8;
        } while (lVar22 != lVar7);
      }
      pcVar19 = (char *)0x4;
      pcStack_188 = (code *)0x10ac67;
      sVar9 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar9 == 1) {
        pcVar19 = (char *)0x3;
        pcStack_188 = (code *)0x10ac8f;
        sVar9 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar9) {
          pcVar19 = (char *)0x8;
          pcStack_188 = (code *)0x10acb6;
          sVar9 = fwrite(qt_hdr.offset,8,(long)qt_hdr.n_hdr,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar9) {
            if (0 < qt_hdr.n_hdr) {
              __filename_00 = msg_hdr;
              pcVar18 = (char *)0x0;
              do {
                pcVar19 = (char *)0x4;
                pcStack_188 = (code *)0x10aceb;
                sVar9 = fwrite(__filename_00,4,1,(FILE *)ofp);
                if ((int)sVar9 != 1) goto LAB_0010ae50;
                pcVar19 = (char *)0x18;
                pcStack_188 = (code *)0x10ad0c;
                sVar9 = fwrite(__filename_00->qt_msg,0x18,(long)__filename_00->n_msg,(FILE *)ofp);
                if (__filename_00->n_msg != (int)sVar9) goto LAB_0010ae50;
                pcVar18 = pcVar18 + 1;
                __filename_00 = __filename_00 + 1;
              } while ((long)pcVar18 < (long)qt_hdr.n_hdr);
            }
            pcStack_188 = (code *)0x10ad42;
            pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
            uVar13 = in_line._0_4_;
            do {
              in_line._0_4_ = uVar13;
              if (pcVar18 == (char *)0x0) {
                pcStack_188 = (code *)0x10ae32;
                fclose((FILE *)ifp);
                pcStack_188 = (code *)0x10ae3e;
                fclose((FILE *)ofp);
                return;
              }
              uVar26 = uVar13 & 0xff;
              if (uVar26 != 0x23) {
                if (uVar26 == 0x25) {
                  uVar6 = uVar13 >> 8 & 0xff;
                  if ((uVar6 == 0x45) || (uVar6 == 0x43)) {
                    in_line[1] = (char)(uVar13 >> 8);
                    in_msg = in_line[1] == 'C';
                  }
                  else if ((char)uVar13 != '#') goto LAB_0010ada7;
                }
                else {
LAB_0010ada7:
                  if (in_msg == '\0') {
                    pcStack_188 = (code *)0x10adb8;
                    sVar9 = strlen(in_line);
                    if (sVar9 == 1) goto LAB_0010ae09;
                  }
                  pbVar10 = &xcrypt_buf;
                  if ((char)uVar13 != '\0') {
                    iVar4 = 1;
                    pcVar18 = in_line;
                    pbVar10 = &xcrypt_buf;
                    do {
                      pcVar18 = (char *)((byte *)pcVar18 + 1);
                      bVar17 = (byte)iVar4;
                      if ((uVar26 & 0x60) == 0) {
                        bVar17 = 0;
                      }
                      *pbVar10 = bVar17 ^ (byte)uVar26;
                      iVar4 = iVar4 * 2;
                      if (0x1f < iVar4) {
                        iVar4 = 1;
                      }
                      pbVar10 = pbVar10 + 1;
                      uVar26 = (uint)(byte)*pcVar18;
                    } while (*pcVar18 != 0);
                  }
                  *pbVar10 = 0;
                  pcStack_188 = (code *)0x10ae09;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ae09:
              pcStack_188 = (code *)0x10ae1d;
              pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
              uVar13 = in_line._0_4_;
            } while( true );
          }
        }
      }
LAB_0010ae50:
      pcStack_188 = (code *)0x10ae55;
      do_questtxt_cold_5();
      goto LAB_0010ae55;
    }
  }
  pcStack_188 = do_rumors;
  __filename_02 = __filename_00;
  do_questtxt_cold_6();
  pcStack_1c0 = (code *)0x10ae88;
  pcStack_1b8 = extraout_RAX;
  pmStack_1b0 = __filename_00;
  pcStack_1a8 = unaff_R12;
  pcStack_1a0 = unaff_R13;
  pcStack_198 = pcVar18;
  pmStack_190 = unaff_R15;
  pcStack_188 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar18 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_1c0 = (code *)0x10b0b8;
    do_rumors_cold_3();
LAB_0010b0b8:
    pcStack_1c0 = (code *)0x10b0c4;
    do_rumors_cold_2();
  }
  else {
    pcStack_1c0 = (code *)0x10aeab;
    pcStack_1b8 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_1c0 = (code *)0x10aeba;
    ifp = (FILE *)fopen((char *)__filename_02,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010b0b8;
    unaff_R13 = (char *)0x0;
    pcStack_1c0 = (code *)0x10aedc;
    fseek((FILE *)ifp,0,2);
    pcStack_1c0 = (code *)0x10aee8;
    lVar7 = ftell((FILE *)ifp);
    pcStack_1c0 = (code *)0x10af00;
    fprintf((FILE *)ofp,"%06lx\n",lVar7);
    pcStack_1c0 = (code *)0x10af10;
    fseek((FILE *)ifp,0,0);
    pcStack_1c0 = (code *)0x10af28;
    pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar11 != (char *)0x0) {
      __filename_02 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar18 = (char *)0x1;
      do {
        pbVar10 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar11 = in_line;
          pbVar10 = &xcrypt_buf;
          bVar17 = in_line[0];
          do {
            pcVar11 = (char *)((byte *)pcVar11 + 1);
            bVar21 = (byte)iVar4;
            if ((bVar17 & 0x60) == 0) {
              bVar21 = 0;
            }
            *pbVar10 = bVar21 ^ bVar17;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar10 = pbVar10 + 1;
            bVar17 = *pcVar11;
          } while (bVar17 != 0);
        }
        *pbVar10 = 0;
        pcStack_1c0 = (code *)0x10af9d;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_1c0 = (code *)0x10afb1;
        pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar11 != (char *)0x0);
    }
    pcStack_1c0 = (code *)0x10afc2;
    fclose((FILE *)ifp);
    pcStack_1c0 = (code *)0x10afd1;
    ifp = (FILE *)fopen(pcVar19,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_1c0 = (code *)0x10aff9;
      pcVar18 = fgets(in_line,0x100,(FILE *)ifp);
      while (pcVar18 != (char *)0x0) {
        pbVar10 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar18 = in_line;
          pbVar10 = &xcrypt_buf;
          bVar17 = in_line[0];
          do {
            pcVar18 = (char *)((byte *)pcVar18 + 1);
            bVar21 = (byte)iVar4;
            if ((bVar17 & 0x60) == 0) {
              bVar21 = 0;
            }
            *pbVar10 = bVar21 ^ bVar17;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar10 = pbVar10 + 1;
            bVar17 = *pcVar18;
          } while (bVar17 != 0);
        }
        *pbVar10 = 0;
        pcStack_1c0 = (code *)0x10b071;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_1c0 = (code *)0x10b085;
        pcVar18 = fgets(in_line,0x100,(FILE *)ifp);
      }
      pcStack_1c0 = (code *)0x10b096;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_1c0 = do_oracles;
  pcVar11 = pcStack_1b8;
  __filename_01 = pcVar19;
  do_rumors_cold_1();
  pcStack_1e8 = pcVar18;
  pcStack_1e0 = unaff_R12;
  pcStack_1d8 = unaff_R13;
  pcStack_1d0 = pcVar19;
  pmStack_1c8 = __filename_02;
  pcStack_1c0 = (code *)unaff_RBP;
  sprintf(acStack_3f0,"%s.%s",pcVar11,"tmp");
  ifp = (FILE *)fopen(__filename_01,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b5e1:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar11,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_3f0,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar7 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
        lVar7 = 0;
        do {
          pbVar10 = (byte *)special_oracle[lVar7];
          bVar17 = *pbVar10;
          pbVar14 = &xcrypt_buf;
          if (bVar17 != 0) {
            iVar4 = 1;
            pbVar14 = &xcrypt_buf;
            do {
              pbVar10 = pbVar10 + 1;
              bVar21 = (byte)iVar4;
              if ((bVar17 & 0x60) == 0) {
                bVar21 = 0;
              }
              *pbVar14 = bVar21 ^ bVar17;
              iVar4 = iVar4 * 2;
              if (0x1f < iVar4) {
                iVar4 = 1;
              }
              pbVar14 = pbVar14 + 1;
              bVar17 = *pbVar10;
            } while (bVar17 != 0);
          }
          *pbVar14 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar7 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
        uVar13 = 1;
LAB_0010b29a:
        bVar2 = true;
LAB_0010b29d:
        while (pcVar18 = fgets(in_line,0x100,(FILE *)ifp), pcVar18 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_2f0);
            if (in_line[4] == '-' && in_line._0_4_ == 0x2d2d2d2d) goto code_r0x0010b2e9;
            pbVar10 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar4 = 1;
              pcVar18 = in_line;
              pbVar10 = &xcrypt_buf;
              bVar17 = in_line[0];
              do {
                pcVar18 = (char *)((byte *)pcVar18 + 1);
                bVar21 = (byte)iVar4;
                if ((bVar17 & 0x60) == 0) {
                  bVar21 = 0;
                }
                *pbVar10 = bVar21 ^ bVar17;
                iVar4 = iVar4 * 2;
                if (0x1f < iVar4) {
                  iVar4 = 1;
                }
                pbVar10 = pbVar10 + 1;
                bVar17 = *pcVar18;
              } while (bVar17 != 0);
            }
            *pbVar10 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          uVar13 = uVar13 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar7 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
        }
        lVar7 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_3f0);
        iVar4 = fseek((FILE *)tfp,0,0);
        if (iVar4 == 0) {
          pcVar18 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar18 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar18 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_3f0);
          sprintf(in_line,"rewind of \"%s\"",pcVar11);
          iVar4 = fseek((FILE *)ofp,0,0);
          if (iVar4 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar11);
            iVar4 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar13);
            if (-1 < iVar4) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar11);
              iVar4 = uVar13 + 1;
              while ((((lVar8 = ftell((FILE *)ofp), -1 < lVar8 &&
                       (iVar5 = fseek((FILE *)ofp,lVar8,0), -1 < iVar5)) &&
                      (iVar5 = __isoc99_fscanf(ofp,"%5lx",alStack_2f0), iVar5 == 1)) &&
                     ((iVar5 = fseek((FILE *)ofp,lVar8,0), -1 < iVar5 &&
                      (iVar5 = fprintf((FILE *)ofp,"%05lx\n",alStack_2f0[0] + lVar7), -1 < iVar5))))
                    ) {
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b5e1;
      }
      goto LAB_0010b5f1;
    }
  }
  do_oracles_cold_3();
LAB_0010b5f1:
  pcVar18 = acStack_3f0;
  do_oracles_cold_2();
  lVar7 = (long)qt_hdr.n_hdr;
  if (0 < lVar7) {
    __s2 = qt_hdr.id;
    lVar8 = 0;
    do {
      iVar4 = strncmp(pcVar18,*__s2,3);
      if (iVar4 == 0) {
        return;
      }
      lVar8 = lVar8 + 1;
      __s2 = __s2 + 1;
    } while (lVar7 != lVar8);
  }
  return;
code_r0x0010b2e9:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010b364;
  goto LAB_0010b29d;
LAB_0010b364:
  uVar13 = uVar13 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar7 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
  goto LAB_0010b29a;
}

Assistant:

void do_permonst(const char *outfile)
{
	int	i;
	char	*c, *nam;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s", Dont_Edit_Code);
	fprintf(ofp,"#ifndef PM_H\n#define PM_H\n");

	if (strcmp(mons[0].mname, "playermon") != 0)
		fprintf(ofp,"\n#define\tPM_PLAYERMON\t(-1)");

	for (i = 0; mons[i].mlet; i++) {
		fprintf(ofp,"\n#define\tPM_");
		if (mons[i].mlet == S_HUMAN &&
				!strncmp(mons[i].mname, "were", 4))
		    fprintf(ofp, "HUMAN_");
		for (nam = c = tmpdup(mons[i].mname); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';
		fprintf(ofp,"%s\t%d", nam, i);
	}
	fprintf(ofp,"\n\n#define\tNUMMONS\t%d\n", i);
	fprintf(ofp,"\n#endif /* PM_H */\n");
	fclose(ofp);
	return;
}